

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::RuleTests_RemainingSpanWithNT_Test::TestBody(RuleTests_RemainingSpanWithNT_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *message;
  char *in_RCX;
  string_view line;
  AssertHelper local_158;
  Message local_150;
  Span local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  Span s;
  NT local_120;
  undefined2 local_104;
  undefined2 uStack_102;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  SpanPair nt;
  undefined1 local_f0 [8];
  PhrasalRule rule;
  size_t local_60;
  undefined1 local_58 [8];
  AlignedSentencePair asp;
  RuleTests_RemainingSpanWithNT_Test *this_local;
  
  asp.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&rule.sentence,
             "a c e\tb d f\t0-0 1-1 2-2");
  line._M_str = in_RCX;
  line._M_len = local_60;
  readAlignedSentencePair<false,false>((AlignedSentencePair *)local_58,(thrax *)rule.sentence,line);
  PhrasalRule::PhrasalRule((PhrasalRule *)local_f0,(AlignedSentencePair *)local_58);
  local_104 = 1;
  uStack_102 = 2;
  uStack_100 = 1;
  uStack_fe = 2;
  NT::NT(&local_120,(SpanPair)0x2000100020001);
  pvVar2 = std::array<jhu::thrax::NT,_4UL>::front((array<jhu::thrax::NT,_4UL> *)local_f0);
  (pvVar2->label)._M_str = local_120.label._M_str;
  pvVar2->span = local_120.span;
  (pvVar2->label)._M_len = local_120.label._M_len;
  rule.nts._M_elems[3].label._M_str._0_4_ = (int)rule.nts._M_elems[3].label._M_str + 1;
  gtest_ar.message_.ptr_._4_2_ = 2;
  gtest_ar.message_.ptr_._6_2_ = 3;
  local_144 = PhrasalRule::remainingSource((PhrasalRule *)local_f0);
  testing::internal::EqHelper<false>::Compare<jhu::thrax::Span,jhu::thrax::Span>
            ((EqHelper<false> *)local_140,"s","rule.remainingSource()",
             (Span *)((long)&gtest_ar.message_.ptr_ + 4),&local_144);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/rule_test.cpp"
               ,0x14,message);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  AlignedSentencePair::~AlignedSentencePair((AlignedSentencePair *)local_58);
  return;
}

Assistant:

TEST(RuleTests, RemainingSpanWithNT) {
  auto asp = readAlignedSentencePair<false, false>("a c e\tb d f\t0-0 1-1 2-2");
  PhrasalRule rule{asp};
  SpanPair nt{{1, 2}, {1, 2}};
  rule.nts.front() = nt;
  rule.nextNT++;
  Span s{2, 3};
  EXPECT_EQ(s, rule.remainingSource());
}